

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

ModelPtr __thiscall libcellml::Annotator::model(Annotator *this,string *id)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ModelPtr MVar1;
  shared_ptr<libcellml::AnyCellmlElement> local_30;
  string *id_local;
  Annotator *this_local;
  
  id_local = id;
  this_local = this;
  item((Annotator *)&local_30,id);
  std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&local_30);
  AnyCellmlElement::model((AnyCellmlElement *)this);
  std::shared_ptr<libcellml::AnyCellmlElement>::~shared_ptr(&local_30);
  MVar1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ModelPtr)MVar1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModelPtr Annotator::model(const std::string &id)
{
    return item(id)->model();
}